

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall gl4cts::ShaderSubroutine::FunctionalTest12::testImage(FunctionalTest12 *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  GLuint subroutine_index;
  GLuint subroutine_index_00;
  GLuint GVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *__filename;
  FunctionalTest12 *this_00;
  framebuffer framebuffer;
  texture destination_texture;
  texture red_texture;
  texture blue_texture;
  vertexArray vao;
  texture color_texture;
  program program;
  
  framebuffer.m_context = (this->super_TestCase).m_context;
  blue_texture.m_id = 0;
  destination_texture.m_id = 0;
  color_texture.m_id = 0;
  framebuffer.m_id = 0;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  red_texture.m_id = 0;
  vao.m_id = 0;
  destination_texture.m_context = framebuffer.m_context;
  red_texture.m_context = framebuffer.m_context;
  blue_texture.m_context = framebuffer.m_context;
  vao.m_context = framebuffer.m_context;
  color_texture.m_context = framebuffer.m_context;
  program.m_context = framebuffer.m_context;
  Utils::program::build
            (&program,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n#extension GL_ARB_shader_subroutine       : require\n\nprecision highp float;\n\nlayout(location = 0) out uvec4 out_color;\n\nlayout(rgba32ui) uniform uimage2D left_image;\nlayout(rgba32ui) uniform uimage2D right_image;\n\nsubroutine void image_routine(void);\n\nsubroutine(image_routine) void left_to_right(void)\n{\n    out_color = imageLoad (left_image,  ivec2(gl_FragCoord.xy));\n                imageStore(right_image, ivec2(gl_FragCoord.xy), out_color);\n}\n\nsubroutine(image_routine) void right_to_left(void)\n{\n    out_color = imageLoad (right_image, ivec2(gl_FragCoord.xy));\n                imageStore(left_image,  ivec2(gl_FragCoord.xy), out_color);\n}\n\nsubroutine uniform image_routine routine;\n\nvoid main()\n{\n    routine();\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    gl_Position = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4(-1,  1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1,  1, 0, 1);\n    EmitVertex();\n    \n    EndPrimitive();\n}\n\n"
             ,(GLchar *)0x0,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
             ,(GLchar **)0x0,0,false);
  iVar6 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar6) + 0x1680))(program.m_program_object_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
  glu::checkError(dVar7,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28f);
  Utils::vertexArray::generate(&vao);
  iVar6 = (*(vao.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0xd8))(vao.m_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
  glu::checkError(dVar7,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x309);
  Utils::texture::create(&blue_texture,0x10,0x10,0x8d70);
  Utils::texture::create(&destination_texture,0x10,0x10,0x8d70);
  Utils::texture::create(&color_texture,0x10,0x10,0x8d70);
  this_00 = (FunctionalTest12 *)&red_texture;
  Utils::texture::create((texture *)this_00,0x10,0x10,0x8d70);
  fillTexture(this_00,&blue_texture,testImage::blue_color);
  fillTexture(this_00,&destination_texture,testImage::clean_color);
  fillTexture(this_00,&red_texture,testImage::red_color);
  Utils::framebuffer::generate(&framebuffer);
  iVar6 = (*(framebuffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x78))(0x8ca9,framebuffer.m_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x800))();
  glu::checkError(dVar7,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xa6);
  Utils::framebuffer::attachTexture(&framebuffer,0x8ce0,color_texture.m_id,0x10,0x10);
  iVar6 = (*(framebuffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x1c0))(0,0,0,0);
  dVar7 = (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x800))();
  glu::checkError(dVar7,"ClearColor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xc1);
  iVar6 = (*(framebuffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x188))(0x4000);
  dVar7 = (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x800))();
  glu::checkError(dVar7,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xb2);
  subroutine_index = Utils::program::getSubroutineIndex(&program,"left_to_right",0x8b30);
  subroutine_index_00 = Utils::program::getSubroutineIndex(&program,"right_to_left",0x8b30);
  GVar8 = Utils::program::getUniformLocation(&program,"left_image");
  this->m_left_image = GVar8;
  GVar8 = Utils::program::getUniformLocation(&program,"right_image");
  this->m_right_image = GVar8;
  bVar1 = testImageDraw(this,subroutine_index,&blue_texture,&destination_texture,
                        testImage::blue_color,testImage::blue_color);
  bVar2 = testImageDraw(this,subroutine_index,&red_texture,&destination_texture,testImage::red_color
                        ,testImage::red_color);
  bVar3 = testImageDraw(this,subroutine_index_00,&destination_texture,&blue_texture,
                        testImage::blue_color,testImage::blue_color);
  bVar4 = testImageDraw(this,subroutine_index_00,&destination_texture,&red_texture,
                        testImage::red_color,testImage::red_color);
  __filename = (char *)(ulong)subroutine_index;
  bVar5 = testImageDraw(this,subroutine_index,&blue_texture,&red_texture,testImage::blue_color,
                        testImage::blue_color);
  Utils::vertexArray::~vertexArray(&vao);
  Utils::texture::~texture(&red_texture);
  Utils::program::remove(&program,__filename);
  Utils::framebuffer::~framebuffer(&framebuffer);
  Utils::texture::~texture(&color_texture);
  Utils::texture::~texture(&destination_texture);
  Utils::texture::~texture(&blue_texture);
  return ((bVar3 && bVar4) && (bVar1 && bVar2)) && bVar5;
}

Assistant:

bool FunctionalTest12::testImage()
{
	static const GLchar* fragment_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_image_load_store : require\n"
		"#extension GL_ARB_shader_subroutine       : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout(location = 0) out uvec4 out_color;\n"
		"\n"
		"layout(rgba32ui) uniform uimage2D left_image;\n"
		"layout(rgba32ui) uniform uimage2D right_image;\n"
		"\n"
		"subroutine void image_routine(void);\n"
		"\n"
		"subroutine(image_routine) void left_to_right(void)\n"
		"{\n"
		"    out_color = imageLoad (left_image,  ivec2(gl_FragCoord.xy));\n"
		"                imageStore(right_image, ivec2(gl_FragCoord.xy), out_color);\n"
		"}\n"
		"\n"
		"subroutine(image_routine) void right_to_left(void)\n"
		"{\n"
		"    out_color = imageLoad (right_image, ivec2(gl_FragCoord.xy));\n"
		"                imageStore(left_image,  ivec2(gl_FragCoord.xy), out_color);\n"
		"}\n"
		"\n"
		"subroutine uniform image_routine routine;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    routine();\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = { "left_to_right", "right_to_left" };

	static const GLchar* uniform_names[] = { "left_image", "right_image" };

	/* Test data */
	static const GLuint blue_color[4]  = { 0, 0, 255, 255 };
	static const GLuint clean_color[4] = { 16, 32, 64, 128 };
	static const GLuint red_color[4]   = { 255, 0, 0, 255 };

	/* GL objects */
	Utils::texture	 blue_texture(m_context);
	Utils::texture	 destination_texture(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 red_texture(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	blue_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	destination_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	color_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	red_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);

	fillTexture(blue_texture, blue_color);
	fillTexture(destination_texture, clean_color);
	fillTexture(red_texture, red_color);

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);
	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	framebuffer.clear(GL_COLOR_BUFFER_BIT);

	/* Subroutine indices */
	GLuint left_to_right = program.getSubroutineIndex(subroutine_names[0], GL_FRAGMENT_SHADER);
	GLuint right_to_left = program.getSubroutineIndex(subroutine_names[1], GL_FRAGMENT_SHADER);

	/* Uniform locations */
	m_left_image  = program.getUniformLocation(uniform_names[0]);
	m_right_image = program.getUniformLocation(uniform_names[1]);

	/* Test */
	bool result = true;

	if (false == testImageDraw(left_to_right, blue_texture, destination_texture, blue_color, blue_color))
	{
		result = false;
	}

	if (false == testImageDraw(left_to_right, red_texture, destination_texture, red_color, red_color))
	{
		result = false;
	}

	if (false == testImageDraw(right_to_left, destination_texture, blue_texture, blue_color, blue_color))
	{
		result = false;
	}

	if (false == testImageDraw(right_to_left, destination_texture, red_texture, red_color, red_color))
	{
		result = false;
	}

	if (false == testImageDraw(left_to_right, blue_texture, red_texture, blue_color, blue_color))
	{
		result = false;
	}

	/* Done */
	return result;
}